

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmGetPropertyCommand::HandleCacheMode(cmGetPropertyCommand *this)

{
  ulong uVar1;
  cmState *pcVar2;
  char *pcVar3;
  char *local_58;
  char *value;
  allocator<char> local_39;
  string local_38;
  cmGetPropertyCommand *local_18;
  cmGetPropertyCommand *this_local;
  
  local_18 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_58 = (char *)0x0;
    pcVar2 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    pcVar3 = cmState::GetCacheEntryValue(pcVar2,&this->Name);
    if (pcVar3 != (char *)0x0) {
      pcVar2 = cmMakefile::GetState((this->super_cmCommand).Makefile);
      local_58 = cmState::GetCacheEntryProperty(pcVar2,&this->Name,&this->PropertyName);
    }
    StoreResult(this,local_58);
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"not given name for CACHE scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGetPropertyCommand::HandleCacheMode()
{
  if (this->Name.empty()) {
    this->SetError("not given name for CACHE scope.");
    return false;
  }

  const char* value = nullptr;
  if (this->Makefile->GetState()->GetCacheEntryValue(this->Name)) {
    value = this->Makefile->GetState()->GetCacheEntryProperty(
      this->Name, this->PropertyName);
  }
  this->StoreResult(value);
  return true;
}